

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O0

void __thiscall
PenguinV_Image::ImageTemplate<unsigned_char>::clear(ImageTemplate<unsigned_char> *this)

{
  ImageTemplate<unsigned_char> *in_RDI;
  uchar *in_stack_ffffffffffffffe8;
  
  if (in_RDI->_data != (uchar *)0x0) {
    _deallocate(in_RDI,in_stack_ffffffffffffffe8);
    in_RDI->_data = (uchar *)0x0;
  }
  in_RDI->_width = 0;
  in_RDI->_height = 0;
  in_RDI->_rowSize = 0;
  return;
}

Assistant:

void clear()
        {
            if( _data != nullptr ) {
                _deallocate( _data );
                _data = nullptr;
            }

            _width   = 0;
            _height  = 0;
            _rowSize = 0;
        }